

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_gc_mark_protected_CALL(WorkerP *w,Task *__dq_head)

{
  undefined8 uVar1;
  Worker *pWVar2;
  Task *pTVar3;
  undefined8 *puVar4;
  uint uVar5;
  Task *__dq_head_00;
  long lVar6;
  long lVar7;
  uint64_t *it;
  uint64_t *local_38;
  
  local_38 = protect_iter(&lddmc_protected,0,lddmc_protected.refs_size);
  if (local_38 != (uint64_t *)0x0) {
    lVar6 = (long)__dq_head << 0x1a;
    lVar7 = 0;
    pTVar3 = __dq_head;
    do {
      __dq_head_00 = pTVar3;
      puVar4 = (undefined8 *)protect_next(&lddmc_protected,&local_38,lddmc_protected.refs_size);
      if (__dq_head_00 == w->end) {
        lace_abort_stack_overflow();
      }
      uVar1 = *puVar4;
      __dq_head_00->f = lddmc_gc_mark_rec_WRAP;
      __dq_head_00->thief = (_Worker *)0x1;
      *(undefined8 *)__dq_head_00->d = uVar1;
      pWVar2 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar2->movesplit != '\0') {
          uVar5 = (uint)((int)((ulong)((long)__dq_head - (long)w->dq) >> 6) + 2 +
                        (int)((ulong)((long)w->split - (long)w->dq) >> 6)) >> 1;
          LOCK();
          (pWVar2->ts).ts.split = uVar5;
          UNLOCK();
          w->split = w->dq + uVar5;
          pWVar2->movesplit = '\0';
        }
      }
      else {
        if (pWVar2->movesplit != '\0') {
          pWVar2->movesplit = '\0';
        }
        LOCK();
        (pWVar2->ts).v =
             (lVar6 + (long)w->dq * -0x4000000 & 0xffffffff00000000U) + 0x100000000 |
             (ulong)((long)__dq_head - (long)w->dq) >> 6 & 0xffffffff;
        UNLOCK();
        pWVar2->allstolen = '\0';
        w->split = __dq_head_00 + 1;
        w->allstolen = '\0';
      }
      __dq_head = __dq_head + 1;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + 0x100000000;
      pTVar3 = __dq_head_00 + 1;
    } while (local_38 != (uint64_t *)0x0);
    local_38 = (uint64_t *)0x0;
    for (; lVar7 != 0; lVar7 = lVar7 + 1) {
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head_00)) {
        __dq_head_00->thief = (_Worker *)0x0;
        lddmc_gc_mark_rec_CALL(w,__dq_head_00,*(MDD *)__dq_head_00->d);
      }
      else {
        lddmc_gc_mark_rec_SYNC_SLOW(w,__dq_head_00);
      }
      __dq_head_00 = __dq_head_00 + -1;
    }
  }
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&lddmc_protected, 0, lddmc_protected.refs_size);
    while (it != NULL) {
        MDD *to_mark = (MDD*)protect_next(&lddmc_protected, &it, lddmc_protected.refs_size);
        SPAWN(lddmc_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}